

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-defs.c
# Opt level: O2

void test_ABS(void)

{
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x4c,"%s","ABS(-1) == 1");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x4d,"%s","ABS(0) == 0");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x4e,"%s","ABS(2) == 2");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x4f,"%s","ABS(-0x7fffffff) == 0x7fffffff");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x50,"%s","ABS(-0.0f) == 0.0f");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x51,"%s","ABS(0.0f) == 0.0f");
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-defs.c"
                 ,0x52,"%s","ABS(-1.0f) == 1.0f");
  return;
}

Assistant:

static void
test_ABS(void)
{
    TEST_CHECK(ABS(-1) == 1);
    TEST_CHECK(ABS(0) == 0);
    TEST_CHECK(ABS(2) == 2);
    TEST_CHECK(ABS(-0x7fffffff) == 0x7fffffff);
    TEST_CHECK(ABS(-0.0f) == 0.0f);
    TEST_CHECK(ABS(0.0f) == 0.0f);
    TEST_CHECK(ABS(-1.0f) == 1.0f);
}